

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_complex_op.hpp
# Opt level: O2

quaternion<double> * HAXX::operator*(quaternion<double> *__x,complex<double> *__y)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  quaternion<double> *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar8 [32];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = __x->_M_imag_i;
  uVar2 = __x->_M_imag_j;
  uVar3 = __x->_M_imag_k;
  auVar10._24_8_ = uVar3;
  auVar10._16_8_ = uVar2;
  auVar11._0_8_ = -__x->_M_imag_i;
  auVar11._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = uVar2 ^ 0x8000000000000000;
  auVar4 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])__y->_M_value),4);
  auVar5 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])__y->_M_value),0x51);
  auVar6 = vunpcklpd_avx(auVar11,auVar6);
  dVar1 = __x->_M_imag_k;
  auVar12._8_8_ = dVar1;
  auVar12._0_8_ = dVar1;
  auVar12._16_8_ = dVar1;
  auVar12._24_8_ = dVar1;
  auVar9._8_8_ = auVar9._0_8_;
  auVar9._16_8_ = auVar9._0_8_;
  auVar9._24_8_ = auVar9._0_8_;
  auVar12 = vblendpd_avx(ZEXT1632(auVar6),auVar12,0xc);
  auVar12 = vblendpd_avx(auVar12,auVar9,8);
  auVar7._0_8_ = auVar5._0_8_ * auVar12._0_8_;
  auVar7._8_8_ = auVar5._8_8_ * auVar12._8_8_;
  auVar8._16_8_ = auVar5._16_8_ * auVar12._16_8_;
  auVar8._0_16_ = auVar7;
  auVar8._24_8_ = auVar5._24_8_ * auVar12._24_8_;
  auVar10._0_16_ = auVar7;
  auVar12 = vblendpd_avx(ZEXT1632(CONCAT88(__x->_M_real,__x->_M_real)),auVar10,0xc);
  auVar6 = vfmadd213pd_fma(auVar12,auVar4,auVar8);
  *in_RDI = (quaternion<double>)ZEXT1632(auVar6);
  return in_RDI;
}

Assistant:

inline quaternion<_F> operator*(const quaternion<_F>& __x,
  const std::complex<_F>& __y) {

  quaternion<_F> __r;

  // This is a really naive algorithm
  __r.real(__x.real()   * __y.real()   - __x.imag_i() * __y.imag());
  __r.imag_i(__x.real()   * __y.imag() + __x.imag_i() * __y.real());
  __r.imag_j(__x.imag_j() * __y.real() + __x.imag_k() * __y.imag());
  __r.imag_k(__x.imag_k() * __y.real() - __x.imag_j() * __y.imag());
  
  return __r;

}